

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# faidx.c
# Opt level: O0

int faidx_has_seq(faidx_t *fai,char *seq)

{
  khint_t kVar1;
  khiter_t iter;
  char *seq_local;
  faidx_t *fai_local;
  
  kVar1 = kh_get_s(fai->hash,seq);
  fai_local._4_4_ = (uint)(kVar1 != fai->hash->n_buckets);
  return fai_local._4_4_;
}

Assistant:

int faidx_has_seq(const faidx_t *fai, const char *seq)
{
    khiter_t iter = kh_get(s, fai->hash, seq);
    if (iter == kh_end(fai->hash)) return 0;
    return 1;
}